

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin2file(int handle)

{
  char recbuf [1000];
  int status;
  int jj;
  int ii;
  int c;
  char simple [7];
  size_t nread;
  void *in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe0;
  undefined4 local_418;
  undefined2 local_414;
  undefined1 auStack_412 [1002];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined4 local_17;
  undefined2 local_13;
  undefined1 local_11;
  size_t local_10;
  int local_4;
  
  local_17 = 0x504d4953;
  local_13 = 0x454c;
  local_11 = 0;
  local_20 = 0;
  local_24 = 0;
  do {
    local_1c = fgetc(_stdin);
    if (local_1c == -1 || 1999 < local_24) {
LAB_0011a2b1:
      if (local_20 == 6) {
        local_10 = fread(auStack_412,1,0x3e2,_stdin);
        local_10 = local_10 + 6;
        local_28 = file_write(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,0x11a32e);
        while (local_4 = local_28, local_28 == 0) {
          local_10 = fread(&local_418,1,1000,_stdin);
          if (local_10 == 0) {
            return local_28;
          }
          local_28 = file_write(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,0x11a39a);
        }
      }
      else {
        ffpmsg((char *)0x11a2c7);
        local_4 = 0x68;
      }
      return local_4;
    }
    if (local_1c == *(char *)((long)&local_17 + (long)local_20)) {
      local_20 = local_20 + 1;
      if (local_20 == 6) {
        local_418 = local_17;
        local_414 = local_13;
        goto LAB_0011a2b1;
      }
    }
    else {
      local_20 = 0;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int stdin2file(int handle)  /* handle number */
/*
  Copy the stdin stream to a file.  .
*/
{
    size_t nread;
    char simple[] = "SIMPLE";
    int c, ii, jj, status;
    char recbuf[RECBUFLEN];

    ii = 0;
    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(recbuf, simple, 6);  /* copy "SIMPLE" to buffer */
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (ii != 6)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the buffer */
    nread = fread(recbuf + 6, 1, RECBUFLEN - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    status = file_write(handle, recbuf, nread);
    if (status)
       return(status);

    /* copy the rest of stdin stream */
    while(0 != (nread = fread(recbuf,1,RECBUFLEN, stdin)))
    {
        status = file_write(handle, recbuf, nread);
        if (status)
           return(status);
    }

    return(status);
}